

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O1

iter_type __thiscall
booster::locale::impl_icu::num_format<char>::do_real_put<unsigned_long>
          (num_format<char> *this,iter_type out,ios_base *ios,char_type fill,unsigned_long val)

{
  bool bVar1;
  int iVar2;
  long extraout_RDX;
  long extraout_RDX_00;
  long extraout_RDX_01;
  long lVar3;
  uint uVar4;
  long lVar5;
  iter_type iVar6;
  iter_type iVar7;
  iter_type __s;
  size_t code_points;
  base_formatter local_78;
  formatter<char> local_68;
  num_format<char> *local_60;
  long local_58;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  __s._M_sbuf = out._M_sbuf;
  uVar4 = out._8_4_;
  local_60 = this;
  bVar1 = num_base::use_parent<unsigned_long>(ios,val);
  if (bVar1) {
    bVar1 = true;
    local_78._vptr_base_formatter = (_func_int **)0x0;
  }
  else {
    formatter<char>::create(&local_68,ios,&local_60->loc_,&local_60->enc_);
    local_78 = local_68.super_base_formatter._vptr_base_formatter;
    local_68.super_base_formatter._vptr_base_formatter = (base_formatter)(_func_int **)0x0;
    bVar1 = local_78._vptr_base_formatter == (_func_int **)0x0;
  }
  if (bVar1) {
    __s._8_4_ = uVar4 & 0xff;
    __s._12_4_ = 0;
    iVar6 = std::num_put<char,_std::ostreambuf_iterator<char,_std::char_traits<char>_>_>::
            _M_insert_int<unsigned_long>
                      (&local_60->
                        super_num_put<char,_std::ostreambuf_iterator<char,_std::char_traits<char>_>_>
                       ,__s,ios,fill,val);
    uVar4 = iVar6._8_4_;
  }
  else {
    (**(code **)(*local_78._vptr_base_formatter + 0x18))
              (&local_50,local_78._vptr_base_formatter,val,&local_58);
    lVar3 = *(long *)(ios + 0x10) - local_58;
    if (lVar3 == 0 || *(long *)(ios + 0x10) < local_58) {
      lVar3 = 0;
      lVar5 = 0;
    }
    else {
      lVar5 = 0;
      if ((*(uint *)(ios + 0x18) & 0xb0) != 0x20) {
        lVar5 = lVar3;
      }
      lVar3 = lVar3 - lVar5;
    }
    if (0 < lVar5) {
      lVar5 = lVar5 + 1;
      do {
        if ((uVar4 & 1) == 0) {
          if (*(char_type **)(__s._M_sbuf + 0x28) < *(char_type **)(__s._M_sbuf + 0x30)) {
            **(char_type **)(__s._M_sbuf + 0x28) = fill;
            *(long *)(__s._M_sbuf + 0x28) = *(long *)(__s._M_sbuf + 0x28) + 1;
          }
          else {
            iVar2 = (**(code **)(*(long *)__s._M_sbuf + 0x68))(__s._M_sbuf,fill);
            uVar4 = uVar4 & 0xff;
            if (iVar2 == -1) {
              uVar4 = 1;
            }
          }
        }
        lVar5 = lVar5 + -1;
      } while (1 < lVar5);
    }
    if ((0 < local_48) && ((uVar4 & 1) == 0)) {
      (**(code **)(*(long *)__s._M_sbuf + 0x60))(__s._M_sbuf,local_50);
      local_48 = extraout_RDX;
    }
    if (0 < lVar3) {
      lVar3 = lVar3 + 1;
      do {
        if ((uVar4 & 1) == 0) {
          if (*(char_type **)(__s._M_sbuf + 0x28) < *(char_type **)(__s._M_sbuf + 0x30)) {
            **(char_type **)(__s._M_sbuf + 0x28) = fill;
            *(long *)(__s._M_sbuf + 0x28) = *(long *)(__s._M_sbuf + 0x28) + 1;
          }
          else {
            iVar2 = (**(code **)(*(long *)__s._M_sbuf + 0x68))(__s._M_sbuf,fill);
            uVar4 = uVar4 & 0xff;
            local_48 = extraout_RDX_00;
            if (iVar2 == -1) {
              uVar4 = 1;
            }
          }
        }
        lVar3 = lVar3 + -1;
      } while (1 < lVar3);
    }
    *(undefined8 *)(ios + 0x10) = 0;
    if (local_50 != local_40) {
      operator_delete(local_50);
      local_48 = extraout_RDX_01;
    }
    iVar6._8_8_ = local_48;
    iVar6._M_sbuf = __s._M_sbuf;
  }
  if (local_78._vptr_base_formatter != (_func_int **)0x0) {
    (**(code **)(*local_78._vptr_base_formatter + 8))(local_78._vptr_base_formatter);
  }
  iVar7._8_4_ = uVar4;
  iVar7._M_sbuf = iVar6._M_sbuf;
  iVar7._12_4_ = 0;
  return iVar7;
}

Assistant:

iter_type do_real_put (iter_type out, std::ios_base &ios, char_type fill, ValueType val) const
    {
        formatter_ptr formatter;
        
        if(use_parent<ValueType>(ios,val) || (formatter = formatter_type::create(ios,loc_,enc_)).get() == 0) {
            return std::num_put<char_type>::do_put(out,ios,fill,val);
        }
        
        size_t code_points;
        typedef typename details::cast_traits<ValueType>::cast_type cast_type;
        string_type const &str = formatter->format(static_cast<cast_type>(val),code_points);
        std::streamsize on_left=0,on_right = 0,points = code_points;
        if(points < ios.width()) {
            std::streamsize n = ios.width() - points;
            
            std::ios_base::fmtflags flags = ios.flags() & std::ios_base::adjustfield;
            
            //
            // We do not really know internal point, so we assume that it does not
            // exist. So according to the standard field should be right aligned
            //
            if(flags != std::ios_base::left)
                on_left = n;
            on_right = n - on_left;
        }
        while(on_left > 0) {
            *out++ = fill;
            on_left--;
        }
        std::copy(str.begin(),str.end(),out);
        while(on_right > 0) {
            *out++ = fill;
            on_right--;
        }
        ios.width(0);
        return out;

    }